

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O2

void Fxu_UpdateSingle(Fxu_Matrix *p)

{
  Fxu_Var *pVar1;
  Fxu_Var *pVar2;
  int iVar1;
  Fxu_Single *pFVar2;
  Fxu_Cube *pFVar3;
  Fxu_Var *pVarC;
  Fxu_Var *pVarD;
  
  pFVar2 = Fxu_HeapSingleReadMax(p->pHeapSingle);
  pVar1 = pFVar2->pVar1;
  pVar2 = pFVar2->pVar2;
  Fxu_UpdateCreateNewVars(p,&pVarC,&pVarD,1);
  pFVar3 = Fxu_MatrixAddCube(p,pVarD,0);
  pFVar3->pFirst = pFVar3;
  pVarD->pFirst = pFVar3;
  p->ppTailCubes = &p->pOrderCubes;
  p->pOrderCubes = (Fxu_Cube *)0x0;
  p->pOrderVars = pVar1;
  pVar1->pOrder = pVar2;
  p->ppTailVars = &pVar2->pOrder;
  pVar2->pOrder = (Fxu_Var *)0x1;
  Fxu_UpdateMatrixSingleClean(p,pVar1,pVar2,pVarD);
  if (pVar2->iVar <= pVar1->iVar) {
    __assert_fail("pVar1->iVar < pVar2->iVar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                  ,0xb9,"void Fxu_UpdateSingle(Fxu_Matrix *)");
  }
  iVar1 = Fxu_SingleCountCoincidence(p,pVar1,pVar2);
  if (iVar1 != 0) {
    __assert_fail("Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                  ,0xba,"void Fxu_UpdateSingle(Fxu_Matrix *)");
  }
  Fxu_MatrixAddLiteral(p,pFVar3,pVar1);
  Fxu_MatrixAddLiteral(p,pFVar3,pVar2);
  pFVar3 = p->pOrderCubes;
  if (pFVar3 != (Fxu_Cube *)0x0) {
    for (; pFVar3 != (Fxu_Cube *)0x1; pFVar3 = pFVar3->pOrder) {
      Fxu_UpdateAddNewDoubles(p,pFVar3);
    }
  }
  Fxu_UpdateCleanOldSingles(p);
  Fxu_MatrixRingCubesUnmark(p);
  Fxu_MatrixRingVarsUnmark(p);
  Fxu_MatrixComputeSinglesOne(p,pVarC);
  Fxu_MatrixComputeSinglesOne(p,pVarD);
  p->nDivs1 = p->nDivs1 + 1;
  return;
}

Assistant:

void Fxu_UpdateSingle( Fxu_Matrix * p )
{
    Fxu_Single * pSingle;
    Fxu_Cube * pCube, * pCubeNew;
    Fxu_Var * pVarC, * pVarD;
    Fxu_Var * pVar1, * pVar2;

    // read the best divisor from the heap
    pSingle = Fxu_HeapSingleReadMax( p->pHeapSingle );
    // get the variables of this single-cube divisor
    pVar1 = pSingle->pVar1;
    pVar2 = pSingle->pVar2;

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 1 );
    // create one new row (cube)
    pCubeNew = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew->pFirst = pCubeNew;
    // set the first cube
    pVarD->pFirst = pCubeNew;

    // start collecting the affected vars and cubes
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
    // add the vars
    Fxu_MatrixRingVarsAdd( p, pVar1 );
    Fxu_MatrixRingVarsAdd( p, pVar2 );
    // remove the literals and collect the affected cubes
    // remove the divisors associated with this cube
       // add to the affected cube the literal corresponding to the new column
    Fxu_UpdateMatrixSingleClean( p, pVar1, pVar2, pVarD );
    // stop collecting the affected vars and cubes
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );

    // add the literals to the new cube
    assert( pVar1->iVar < pVar2->iVar );
    assert( Fxu_SingleCountCoincidence( p, pVar1, pVar2 ) == 0 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar1 );
    Fxu_MatrixAddLiteral( p, pCubeNew, pVar2 );

    // create new doubles; we cannot add them in the same loop
    // because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
           Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );
    // we should undo the rings before creating new singles

    // unmark the cubes
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );
    p->nDivs1++;
}